

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.hpp
# Opt level: O2

void duckdb::roaring::RoaringStateAppender<duckdb::roaring::RoaringAnalyzeState>::AppendVector
               (RoaringAnalyzeState *state,Vector *input,idx_t input_size)

{
  validity_t entry;
  ulong uVar1;
  uint16_t uVar2;
  idx_t appended;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong amount;
  bool bVar7;
  ulong local_88;
  UnifiedVectorFormat unified;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&unified);
  Vector::ToUnifiedFormat(input,input_size,&unified);
  if (unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    for (uVar1 = 0; uVar3 = input_size - uVar1, uVar1 <= input_size && uVar3 != 0;
        uVar1 = uVar1 + uVar5) {
      uVar5 = 0x800 - (ulong)state->count;
      if (uVar3 <= uVar5) {
        uVar5 = uVar3;
      }
      state->one_count = state->one_count + (short)uVar5;
      state->last_bit_set = true;
      uVar2 = (short)uVar5 + state->count;
      state->count = uVar2;
      if (uVar2 == 0x800) {
        RoaringAnalyzeState::FlushContainer(state);
      }
    }
  }
  else {
    for (local_88 = 0; uVar1 = input_size - local_88, local_88 <= input_size && uVar1 != 0;
        local_88 = local_88 + uVar3) {
      uVar3 = 0x800 - (ulong)state->count;
      if (uVar1 <= uVar3) {
        uVar3 = uVar1;
      }
      uVar5 = local_88 >> 6;
      uVar1 = local_88 & 0x3f;
      if (uVar1 != 0) {
        uVar6 = 0xffffffffffffffff;
        if (unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          uVar6 = unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5];
        }
        amount = 0x40 - uVar1;
        if (uVar3 < amount) {
          uVar4 = (ulong)(&ValidityUncompressed::UPPER_MASKS)[uVar3] >>
                  ((char)amount - (char)uVar3 & 0x3fU);
          amount = uVar3;
        }
        else {
          uVar4 = (&ValidityUncompressed::UPPER_MASKS)[amount];
        }
        uVar1 = (uVar4 & uVar6) >> (sbyte)uVar1;
        if (uVar1 == *(ulong *)(ValidityUncompressed::LOWER_MASKS + amount * 8)) {
          state->one_count = state->one_count + (short)amount;
          state->last_bit_set = true;
          state->count = state->count + (short)amount;
        }
        else if (uVar1 == 0) {
          RoaringAnalyzeState::HandleNoneValid(state,amount);
        }
        else {
          AppendBytes(state,uVar1,amount);
        }
        uVar3 = uVar3 - amount;
        local_88 = local_88 + amount;
        uVar5 = uVar5 + 1;
      }
      uVar1 = uVar3 >> 6;
      uVar6 = uVar5;
      while (bVar7 = uVar1 != 0, uVar1 = uVar1 - 1, bVar7) {
        if (unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
LAB_014c6487:
          state->one_count = state->one_count + 0x40;
          state->last_bit_set = true;
          state->count = state->count + 0x40;
        }
        else {
          entry = unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6];
          if (entry == 0) {
            RoaringAnalyzeState::HandleNoneValid(state,0x40);
          }
          else {
            if (entry == 0xffffffffffffffff) goto LAB_014c6487;
            AppendBytes(state,entry,0x40);
          }
        }
        uVar6 = uVar6 + 1;
      }
      uVar1 = uVar3 & 0x3f;
      if (uVar1 == 0) {
LAB_014c64c0:
        uVar2 = state->count;
      }
      else {
        uVar6 = 0xffffffffffffffff;
        if (unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          uVar6 = unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar5 + (uVar3 >> 6)];
        }
        uVar5 = *(ulong *)(ValidityUncompressed::LOWER_MASKS + uVar1 * 8) & uVar6;
        if (uVar5 != *(ulong *)(ValidityUncompressed::LOWER_MASKS + uVar1 * 8)) {
          if (uVar5 == 0) {
            RoaringAnalyzeState::HandleNoneValid(state,uVar1);
          }
          else {
            AppendBytes(state,uVar6,uVar1);
          }
          goto LAB_014c64c0;
        }
        state->one_count = state->one_count + (short)uVar1;
        state->last_bit_set = true;
        uVar2 = (short)uVar1 + state->count;
        state->count = uVar2;
      }
      if (uVar2 == 0x800) {
        RoaringAnalyzeState::FlushContainer(state);
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&unified);
  return;
}

Assistant:

static void AppendVector(STATE_TYPE &state, Vector &input, idx_t input_size) {
		UnifiedVectorFormat unified;
		input.ToUnifiedFormat(input_size, unified);
		auto &validity = unified.validity;

		if (validity.AllValid()) {
			// All bits are set implicitly
			idx_t appended = 0;
			while (appended < input_size) {
				idx_t to_append =
				    MinValue<idx_t>(ROARING_CONTAINER_SIZE - STATE_TYPE::Count(state), input_size - appended);
				STATE_TYPE::HandleAllValid(state, to_append);
				if (STATE_TYPE::Count(state) == ROARING_CONTAINER_SIZE) {
					STATE_TYPE::Flush(state);
				}
				appended += to_append;
			}
		} else {
			// There is a validity mask
			idx_t appended = 0;
			while (appended < input_size) {
				idx_t to_append =
				    MinValue<idx_t>(ROARING_CONTAINER_SIZE - STATE_TYPE::Count(state), input_size - appended);

				// Deal with a ragged start, when 'appended' isn't a multiple of ValidityMask::BITS_PER_VALUE
				// then we need to process the remainder of the entry
				idx_t entry_offset = appended / ValidityMask::BITS_PER_VALUE;
				auto previous_entry_remainder = appended % ValidityMask::BITS_PER_VALUE;
				if (DUCKDB_UNLIKELY(previous_entry_remainder != 0)) {
					auto validity_entry = validity.GetValidityEntry(entry_offset);

					idx_t to_process = ValidityMask::BITS_PER_VALUE - previous_entry_remainder;
					validity_t mask;
					if (to_append < to_process) {
						// Limit the amount of bits to set
						auto left_bits = to_process - to_append;
						to_process = to_append;
						mask = ValidityUncompressed::UPPER_MASKS[to_process] >> left_bits;
					} else {
						mask = ValidityUncompressed::UPPER_MASKS[to_process];
					}

					auto masked_entry = (validity_entry & mask) >> previous_entry_remainder;
					if (masked_entry == ValidityUncompressed::LOWER_MASKS[to_process]) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, to_process);
					} else if (masked_entry == 0) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, to_process);
					} else {
						// Mixed set/unset bits
						AppendBytes(state, masked_entry, to_process);
					}

					to_append -= to_process;
					appended += to_process;
					entry_offset++;
				}

				auto entry_count = to_append / ValidityMask::BITS_PER_VALUE;
				for (idx_t entry_index = 0; entry_index < entry_count; entry_index++) {
					// get the validity entry at this index
					auto validity_entry = validity.GetValidityEntry(entry_offset + entry_index);
					if (ValidityMask::AllValid(validity_entry)) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, ValidityMask::BITS_PER_VALUE);
					} else if (ValidityMask::NoneValid(validity_entry)) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, ValidityMask::BITS_PER_VALUE);
					} else {
						// Mixed set/unset bits
						AppendBytes(state, validity_entry, ValidityMask::BITS_PER_VALUE);
					}
				}

				// Deal with a ragged end, when the validity entry isn't entirely used
				idx_t remainder = to_append % ValidityMask::BITS_PER_VALUE;
				if (DUCKDB_UNLIKELY(remainder != 0)) {
					auto validity_entry = validity.GetValidityEntry(entry_offset + entry_count);
					auto masked = validity_entry & ValidityUncompressed::LOWER_MASKS[remainder];
					if (masked == ValidityUncompressed::LOWER_MASKS[remainder]) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, remainder);
					} else if (masked == 0) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, remainder);
					} else {
						AppendBytes(state, validity_entry, remainder);
					}
				}

				if (STATE_TYPE::Count(state) == ROARING_CONTAINER_SIZE) {
					STATE_TYPE::Flush(state);
				}
				appended += to_append;
			}
		}
	}